

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O3

void __thiscall
kj::UnixEventPort::FdObserver::FdObserver
          (FdObserver *this,UnixEventPort *eventPort,int fd,uint flags)

{
  int iVar1;
  Fault f;
  Fault local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  uint32_t local_2c;
  FdObserver *local_28;
  
  this->eventPort = eventPort;
  this->fd = fd;
  this->flags = flags;
  (this->readFulfiller).ptr.disposer = (Disposer *)0x0;
  (this->readFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this->writeFulfiller).ptr.disposer = (Disposer *)0x0;
  (this->writeFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this->urgentFulfiller).ptr.disposer = (Disposer *)0x0;
  (this->urgentFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this->hupFulfiller).ptr.disposer = (Disposer *)0x0;
  (this->hupFulfiller).ptr.ptr = (PromiseFulfiller<void> *)0x0;
  (this->atEnd).ptr.isSet = false;
  local_2c = (-(flags & 1) & 0x2001) + (flags & 2) * 2 + (flags >> 1 & 2) + 0x80000000;
  local_28 = this;
  do {
    iVar1 = epoll_ctl((eventPort->epollFd).fd,1,fd,(epoll_event *)&local_2c);
    if (-1 < iVar1) {
      return;
    }
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
    return;
  }
  local_50.exception = (Exception *)0x0;
  local_48 = 0;
  uStack_40 = 0;
  _::Debug::Fault::init
            (&local_50,
             (EVP_PKEY_CTX *)
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-unix.c++"
            );
  _::Debug::Fault::fatal(&local_50);
}

Assistant:

UnixEventPort::FdObserver::FdObserver(UnixEventPort& eventPort, int fd, uint flags)
    : eventPort(eventPort), fd(fd), flags(flags) {
  struct epoll_event event;
  memset(&event, 0, sizeof(event));

  if (flags & OBSERVE_READ) {
    event.events |= EPOLLIN | EPOLLRDHUP;
  }
  if (flags & OBSERVE_WRITE) {
    event.events |= EPOLLOUT;
  }
  if (flags & OBSERVE_URGENT) {
    event.events |= EPOLLPRI;
  }
  event.events |= EPOLLET;  // Set edge-triggered mode.

  event.data.ptr = this;

  KJ_SYSCALL(epoll_ctl(eventPort.epollFd, EPOLL_CTL_ADD, fd, &event));
}